

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

LaneArray<2> * __thiscall
wasm::Literal::getLanesI64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  bool bVar5;
  array<unsigned_char,_16UL> aVar6;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  undefined1 local_38 [8];
  array<unsigned_char,_16UL> bytes;
  
  if ((this->type).id == 6) {
    aVar6 = getv128(this);
    local_38[0] = aVar6._M_elems[0];
    local_38[1] = aVar6._M_elems[1];
    local_38[2] = aVar6._M_elems[2];
    local_38[3] = aVar6._M_elems[3];
    local_38[4] = aVar6._M_elems[4];
    local_38[5] = aVar6._M_elems[5];
    local_38[6] = aVar6._M_elems[6];
    local_38[7] = aVar6._M_elems[7];
    bytes._M_elems[0] = aVar6._M_elems[8];
    bytes._M_elems[1] = aVar6._M_elems[9];
    bytes._M_elems[2] = aVar6._M_elems[10];
    bytes._M_elems[3] = aVar6._M_elems[0xb];
    bytes._M_elems[4] = aVar6._M_elems[0xc];
    bytes._M_elems[5] = aVar6._M_elems[0xd];
    bytes._M_elems[6] = aVar6._M_elems[0xe];
    bytes._M_elems[7] = aVar6._M_elems[0xf];
    __return_storage_ptr__->_M_elems[0].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[0].type.id = 0;
    __return_storage_ptr__->_M_elems[1].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[1].type.id = 0;
    lVar2 = 0;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      pbVar4 = local_38 + lVar2 * 8;
      lVar3 = 0;
      local_50.i64 = 0;
      do {
        local_50.func.super_IString.str._M_len =
             local_50.func.super_IString.str._M_len | (ulong)*pbVar4 << ((byte)lVar3 & 0x3f);
        lVar3 = lVar3 + 8;
        pbVar4 = pbVar4 + 1;
      } while (lVar3 != 0x40);
      local_40 = 3;
      this_00 = &__return_storage_ptr__->_M_elems[lVar2].field_0;
      if (this_00 != &local_50) {
        ~Literal((Literal *)&this_00->func);
        Literal((Literal *)&this_00->func,(Literal *)&local_50.func);
      }
      ~Literal((Literal *)&local_50.func);
      lVar2 = 1;
      bVar1 = false;
    } while (bVar5);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = long, Lanes = 2]")
  ;
}

Assistant:

LaneArray<2> Literal::getLanesI64x2() const {
  return getLanes<int64_t, 2>(*this);
}